

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

int __thiscall cmXMLParser::InitializeParser(cmXMLParser *this)

{
  ostream *this_00;
  XML_Parser pXVar1;
  bool bVar2;
  cmXMLParser *this_local;
  
  bVar2 = this->Parser == (void *)0x0;
  if (bVar2) {
    pXVar1 = XML_ParserCreate((XML_Char *)0x0);
    this->Parser = pXVar1;
    XML_SetElementHandler((XML_Parser)this->Parser,cmXMLParserStartElement,cmXMLParserEndElement);
    XML_SetCharacterDataHandler((XML_Parser)this->Parser,cmXMLParserCharacterDataHandler);
    XML_SetUserData((XML_Parser)this->Parser,this);
    this->ParseError = 0;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Parser already initialized");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->ParseError = 1;
  }
  this_local._4_4_ = (uint)bVar2;
  return this_local._4_4_;
}

Assistant:

int cmXMLParser::InitializeParser()
{
  if (this->Parser) {
    std::cerr << "Parser already initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }

  // Create the expat XML parser.
  this->Parser = XML_ParserCreate(CM_NULLPTR);
  XML_SetElementHandler(static_cast<XML_Parser>(this->Parser),
                        &cmXMLParserStartElement, &cmXMLParserEndElement);
  XML_SetCharacterDataHandler(static_cast<XML_Parser>(this->Parser),
                              &cmXMLParserCharacterDataHandler);
  XML_SetUserData(static_cast<XML_Parser>(this->Parser), this);
  this->ParseError = 0;
  return 1;
}